

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

float rr::advblend::colorburn(float src,float dst)

{
  float fVar1;
  float dst_local;
  float src_local;
  
  if (dst < 1.0) {
    if (src <= 0.0) {
      dst_local = 0.0;
    }
    else {
      fVar1 = de::min<float>(1.0,(1.0 - dst) / src);
      dst_local = 1.0 - fVar1;
    }
  }
  else {
    dst_local = 1.0;
  }
  return dst_local;
}

Assistant:

inline float colorburn (float src, float dst)
{
	if (dst >= 1.0f)
		return 1.0f;
	else if (src > 0.0f)
		return 1.0f - de::min(1.0f, (1.0f-dst)/src);
	else
		return 0.0f;
}